

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O0

bool __thiscall QPDFObject::getDescription(QPDFObject *this,QPDF **a_qpdf,string *description)

{
  string local_40;
  string *local_20;
  string *description_local;
  QPDF **a_qpdf_local;
  QPDFObject *this_local;
  
  *a_qpdf = this->qpdf;
  local_20 = description;
  description_local = (string *)a_qpdf;
  a_qpdf_local = (QPDF **)this;
  getDescription_abi_cxx11_(&local_40,this);
  std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return this->qpdf != (QPDF *)0x0;
}

Assistant:

bool
    getDescription(QPDF*& a_qpdf, std::string& description)
    {
        a_qpdf = qpdf;
        description = getDescription();
        return qpdf != nullptr;
    }